

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeNext_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5ExprPhrase *pFVar1;
  Fts5IndexIter *pFVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  i64 iVar6;
  Fts5ExprTerm *pTerm;
  bool bVar7;
  
  pFVar1 = pNode->pNear->apPhrase[0];
  pNode->bNomatch = 0;
  if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    pFVar2 = pFVar1->aTerm[0].pIter;
    if (bFromValid == 0) {
      iVar5 = sqlite3Fts5IterNext(pFVar2);
    }
    else {
      iVar5 = sqlite3Fts5IterNextFrom(pFVar2,iFrom);
    }
    bVar7 = true;
    if (iVar5 == 0) {
      bVar7 = pFVar2->bEof != '\0';
    }
  }
  else {
    pTerm = pFVar1->aTerm;
    iVar6 = fts5ExprSynonymRowid(pTerm,pExpr->bDesc,(int *)0x0);
    bVar7 = true;
    for (; pTerm != (Fts5ExprTerm *)0x0; pTerm = pTerm->pSynonym) {
      pFVar2 = pTerm->pIter;
      bVar4 = bVar7;
      if (pFVar2->bEof == '\0') {
        lVar3 = pFVar2->iRowid;
        if (lVar3 == iVar6) {
          if (bFromValid != 0) goto LAB_0019345e;
          iVar5 = sqlite3Fts5IterNext(pFVar2);
        }
        else {
          bVar4 = false;
          if (((bFromValid == 0) || (lVar3 == iFrom)) ||
             (bVar4 = false, pExpr->bDesc != (uint)(iFrom < lVar3))) goto LAB_0019347f;
LAB_0019345e:
          iVar5 = sqlite3Fts5IterNextFrom(pFVar2,iFrom);
        }
        if (iVar5 != 0) goto LAB_0019348b;
        bVar4 = bVar7;
        if (pTerm->pIter->bEof == '\0') {
          bVar4 = false;
        }
      }
LAB_0019347f:
      bVar7 = bVar4;
    }
    iVar5 = 0;
LAB_0019348b:
    bVar7 = bVar7 || iVar5 != 0;
  }
  pNode->bEof = (uint)bVar7;
  if (bVar7 == false) {
    iVar5 = fts5ExprNodeTest_STRING(pExpr,pNode);
    return iVar5;
  }
  return iVar5;
}

Assistant:

static int fts5ExprNodeNext_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode,            /* FTS5_STRING or FTS5_TERM node */
  int bFromValid,
  i64 iFrom 
){
  Fts5ExprTerm *pTerm = &pNode->pNear->apPhrase[0]->aTerm[0];
  int rc = SQLITE_OK;

  pNode->bNomatch = 0;
  if( pTerm->pSynonym ){
    int bEof = 1;
    Fts5ExprTerm *p;

    /* Find the firstest rowid any synonym points to. */
    i64 iRowid = fts5ExprSynonymRowid(pTerm, pExpr->bDesc, 0);

    /* Advance each iterator that currently points to iRowid. Or, if iFrom
    ** is valid - each iterator that points to a rowid before iFrom.  */
    for(p=pTerm; p; p=p->pSynonym){
      if( sqlite3Fts5IterEof(p->pIter)==0 ){
        i64 ii = p->pIter->iRowid;
        if( ii==iRowid 
         || (bFromValid && ii!=iFrom && (ii>iFrom)==pExpr->bDesc) 
        ){
          if( bFromValid ){
            rc = sqlite3Fts5IterNextFrom(p->pIter, iFrom);
          }else{
            rc = sqlite3Fts5IterNext(p->pIter);
          }
          if( rc!=SQLITE_OK ) break;
          if( sqlite3Fts5IterEof(p->pIter)==0 ){
            bEof = 0;
          }
        }else{
          bEof = 0;
        }
      }
    }

    /* Set the EOF flag if either all synonym iterators are at EOF or an
    ** error has occurred.  */
    pNode->bEof = (rc || bEof);
  }else{
    Fts5IndexIter *pIter = pTerm->pIter;

    assert( Fts5NodeIsString(pNode) );
    if( bFromValid ){
      rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
    }else{
      rc = sqlite3Fts5IterNext(pIter);
    }

    pNode->bEof = (rc || sqlite3Fts5IterEof(pIter));
  }

  if( pNode->bEof==0 ){
    assert( rc==SQLITE_OK );
    rc = fts5ExprNodeTest_STRING(pExpr, pNode);
  }

  return rc;
}